

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.h
# Opt level: O3

cookie * warhawk::common::cookie::parse(cookie *__return_storage_ptr__,string *n_)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  ulonglong uVar5;
  invalid_argument *this;
  undefined8 uVar6;
  char cVar7;
  string *this_00;
  string *this_01;
  string *local_70 [2];
  long local_60 [2];
  int local_4c;
  string *local_48;
  string *local_40;
  string *local_38;
  
  (__return_storage_ptr__->m_domain)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_domain).field_2;
  (__return_storage_ptr__->m_domain)._M_string_length = 0;
  (__return_storage_ptr__->m_domain).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->m_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_path).field_2;
  (__return_storage_ptr__->m_path)._M_string_length = 0;
  (__return_storage_ptr__->m_path).field_2._M_local_buf[0] = '\0';
  this_01 = (string *)&__return_storage_ptr__->m_name;
  (__return_storage_ptr__->m_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_name).field_2;
  (__return_storage_ptr__->m_name)._M_string_length = 0;
  (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  this_00 = (string *)&__return_storage_ptr__->m_value;
  (__return_storage_ptr__->m_value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_value).field_2;
  (__return_storage_ptr__->m_value)._M_string_length = 0;
  (__return_storage_ptr__->m_value).field_2._M_local_buf[0] = '\0';
  cVar7 = (char)n_;
  uVar2 = std::__cxx11::string::find(cVar7,0x3d);
  uVar3 = std::__cxx11::string::find(cVar7,9);
  if (uVar3 < uVar2) {
    local_48 = this_01;
    local_40 = this_00;
    std::__cxx11::string::substr((ulong)local_70,(ulong)n_);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_70);
    if (local_70[0] != (string *)local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::__cxx11::string::find(cVar7,9);
    std::__cxx11::string::substr((ulong)local_70,(ulong)n_);
    iVar1 = std::__cxx11::string::compare((char *)local_70);
    __return_storage_ptr__->m_include_sub = iVar1 != 0;
    if (local_70[0] != (string *)local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::__cxx11::string::find(cVar7,9);
    std::__cxx11::string::substr((ulong)local_70,(ulong)n_);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_path,(string *)local_70);
    if (local_70[0] != (string *)local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::__cxx11::string::find(cVar7,9);
    std::__cxx11::string::substr((ulong)local_70,(ulong)n_);
    iVar1 = std::__cxx11::string::compare((char *)local_70);
    __return_storage_ptr__->m_secure = iVar1 != 0;
    if (local_70[0] != (string *)local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    uVar2 = std::__cxx11::string::find(cVar7,9);
    std::__cxx11::string::substr((ulong)local_70,(ulong)n_);
    this_00 = local_70[0];
    piVar4 = __errno_location();
    local_4c = *piVar4;
    *piVar4 = 0;
    this_01 = (string *)&local_38;
    uVar5 = strtoull((char *)this_00,(char **)this_01,10);
    if (local_38 == this_00) {
      uVar6 = std::__throw_invalid_argument("stoull");
      ~cookie(__return_storage_ptr__);
      _Unwind_Resume(uVar6);
    }
    if (*piVar4 == 0) {
      *piVar4 = local_4c;
    }
    else if (*piVar4 == 0x22) {
      std::__throw_out_of_range("stoull");
      goto LAB_0010f1c7;
    }
    __return_storage_ptr__->m_expires = uVar5;
    if (local_70[0] != (string *)local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::__cxx11::string::find(cVar7,9);
    std::__cxx11::string::substr((ulong)local_70,(ulong)n_);
    std::__cxx11::string::operator=(local_48,(string *)local_70);
    if (local_70[0] != (string *)local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_70,(ulong)n_);
    this_00 = local_40;
  }
  else {
LAB_0010f1c7:
    if (uVar2 == 0xffffffffffffffff) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Unknown format");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::substr((ulong)local_70,(ulong)n_);
    std::__cxx11::string::operator=(this_01,(string *)local_70);
    if (local_70[0] != (string *)local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_70,(ulong)n_);
  }
  std::__cxx11::string::operator=(this_00,(string *)local_70);
  if (local_70[0] != (string *)local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static cookie parse( const std::string &n_ )
  {
    cookie res;
    auto peq  = n_.find( '='  );
    auto ptab = n_.find( '\t' );

    if ( ptab < peq )
    {
      // Netscape
      res.m_domain = n_.substr( 0, ptab );
      auto start = ptab + 1;
      ptab = n_.find( '\t', start );
      res.m_include_sub = n_.substr( start, ptab - start ) != "FALSE";
      start = ptab + 1;
      ptab = n_.find( '\t', start );
      res.m_path = n_.substr( start, ptab - start );
      start = ptab + 1;
      ptab = n_.find( '\t', start );
      res.m_secure = n_.substr( ptab, ptab - start ) != "FALSE";
      start = ptab + 1;
      ptab = n_.find( '\t', start );
      res.m_expires = std::stoull( n_.substr( start, ptab - start ) );
      start = ptab + 1;
      ptab = n_.find( '\t', start );
      res.m_name = n_.substr( start, ptab - start );
      start = ptab + 1;
      res.m_value = n_.substr( start );
    }
    else
    {
      if ( peq == std::string::npos )
      {
        throw std::invalid_argument( "Unknown format" );
      }

      res.m_name  = n_.substr( 0, peq );
      res.m_value = n_.substr( peq + 1 );
    }

    return res;
  }